

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_t sVar1;
  LogMessage *pLVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pcVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  pcVar3 = (result->_M_dataplus)._M_p;
  sVar4 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar3) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63a);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar3 = (result->_M_dataplus)._M_p;
    sVar4 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar3) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63b);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar3 = (result->_M_dataplus)._M_p;
    sVar4 = result->_M_string_length;
  }
  if ((ulong)((long)c->piece_data_ - (long)pcVar3) <= sVar4) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63c);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
    sVar4 = result->_M_string_length;
  }
  std::__cxx11::string::resize((ulong)result);
  pcVar3 = (result->_M_dataplus)._M_p;
  pcVar5 = pcVar3 + sVar4;
  memcpy(pcVar5,a->piece_data_,a->piece_size_);
  pcVar5 = pcVar5 + a->piece_size_;
  memcpy(pcVar5,b->piece_data_,b->piece_size_);
  sVar1 = b->piece_size_;
  memcpy(pcVar5 + sVar1,c->piece_data_,c->piece_size_);
  if (pcVar5 + sVar1 + c->piece_size_ != pcVar3 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x642);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_69,pLVar2);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

void StrAppend(string *result,
               const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}